

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.hpp
# Opt level: O2

void __thiscall TasGrid::CustomTabulated::checkLevel(CustomTabulated *this,int level,string *op)

{
  runtime_error *this_00;
  allocator<char> local_121;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (level < this->num_levels) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"ERROR: needed custom rule ",&local_121);
  std::operator+(&local_c0,&local_e0,op);
  std::operator+(&local_a0,&local_c0," with level ");
  std::__cxx11::to_string(&local_100,level);
  std::operator+(&local_80,&local_a0,&local_100);
  std::operator+(&local_60,&local_80," but the table ends at ");
  std::__cxx11::to_string(&local_120,this->num_levels + -1);
  std::operator+(&local_40,&local_60,&local_120);
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void checkLevel(int level, std::string const &op) const{
        if (level >= num_levels)
            throw std::runtime_error(std::string("ERROR: needed custom rule ") + op + " with level " + std::to_string(level) + " but the table ends at " + std::to_string(num_levels - 1));
    }